

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutoGeometry.cpp
# Opt level: O2

void __thiscall HACD::MyAutoGeometry::mystrlwr(MyAutoGeometry *this,char *str)

{
  byte bVar1;
  char c;
  
  for (; bVar1 = *str, bVar1 != 0; str = (char *)((byte *)str + 1)) {
    if ((byte)(bVar1 + 0xbf) < 0x1a) {
      *str = bVar1 | 0x20;
    }
  }
  return;
}

Assistant:

void mystrlwr(char *str)
		{
			while ( *str )
			{
				char c = *str;
				if ( c >= 'A' && c <= 'Z' )
				{
					c+=32;
					*str = c;
				}
				str++;
			}
		}